

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::CommonVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Options *options)

{
  _anonymous_namespace_ _Var1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *this_00;
  char *pcVar2;
  long lVar3;
  AlphaNum *in_R8;
  allocator_type local_473;
  key_equal local_472;
  hasher local_471;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *local_470;
  char *local_468;
  string local_460;
  string local_440;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  AlphaNum local_f0;
  string_view local_c0 [3];
  AlphaNum local_90;
  string_view local_60 [3];
  
  _Var1 = this[0xca];
  local_470 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               *)__return_storage_ptr__;
  local_60[0] = absl::lts_20250127::NullSafeStringView("::");
  local_90.piece_._M_len = 6;
  if (this[0xca] != (_anonymous_namespace_)0x0) {
    local_90.piece_._M_len = 0x10;
  }
  pcVar2 = "proto2";
  local_90.piece_._M_str = "proto2";
  if (this[0xca] != (_anonymous_namespace_)0x0) {
    local_90.piece_._M_str = "google::protobuf";
  }
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_440,(lts_20250127 *)local_60,&local_90,(AlphaNum *)local_90.piece_._M_str);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_420,(char (*) [3])0x4815a3,&local_440);
  local_c0[0] = absl::lts_20250127::NullSafeStringView("::");
  local_f0.piece_._M_len = 6;
  if (this[0xca] != (_anonymous_namespace_)0x0) {
    pcVar2 = "google::protobuf";
    local_f0.piece_._M_len = 0x10;
  }
  local_f0.piece_._M_str = pcVar2;
  local_120.first = absl::lts_20250127::NullSafeStringView("::internal");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_460,(lts_20250127 *)local_c0,&local_f0,(AlphaNum *)&local_120,in_R8);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3f0,(char (*) [4])"pbi",&local_460);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
            (&local_3c0,(char (*) [7])0x587889,(char (*) [12])"std::string");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
            (&local_390,(char (*) [5])0x43edc4,(char (*) [9])"::int8_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (&local_360,(char (*) [6])0x57e2cb,(char (*) [10])"::int32_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (&local_330,(char (*) [6])0x57e2d2,(char (*) [10])"::int64_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (&local_300,(char (*) [6])"uint8",(char (*) [10])"::uint8_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
            (&local_2d0,(char (*) [7])"uint32",(char (*) [11])"::uint32_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[11],_true>
            (&local_2a0,(char (*) [7])"uint64",(char (*) [11])"::uint64_t");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[],_true>
            (&local_270,(char (*) [12])"hrule_thick",
             "// ===================================================================\n");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_(&)[],_true>
            (&local_240,(char (*) [11])"hrule_thin",
             "// -------------------------------------------------------------------\n");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[18],_true>
            (&local_210,(char (*) [9])"nullable",(char (*) [18])"PROTOBUF_NULLABLE");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[17],_true>
            (&local_1e0,(char (*) [8])"nonnull",(char (*) [17])"PROTOBUF_NONNULL");
  local_468 = "GOOGLE3_PROTOBUF";
  if (_Var1 != (_anonymous_namespace_)0x0) {
    local_468 = "GOOGLE_PROTOBUF";
  }
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_*,_true>
            (&local_1b0,(char (*) [16])"GOOGLE_PROTOBUF",&local_468);
  this_00 = local_470;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[11],_true>
            (&local_180,(char (*) [4])0x43ee6f,(char (*) [11])"ABSL_CHECK");
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[12],_true>
            (&local_150,(char (*) [5])"DCHK",(char (*) [12])"ABSL_DCHECK");
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            (this_00,&local_420,&local_120,0,&local_471,&local_472,&local_473);
  lVar3 = 0x2e0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_420.first._M_len + lVar3));
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  return (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)this_00;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> CommonVars(
    const Options& options) {
  bool is_oss = options.opensource_runtime;
  return {
      {"pb", absl::StrCat("::", ProtobufNamespace(options))},
      {"pbi", absl::StrCat("::", ProtobufNamespace(options), "::internal")},

      {"string", "std::string"},
      {"int8", "::int8_t"},
      {"int32", "::int32_t"},
      {"int64", "::int64_t"},
      {"uint8", "::uint8_t"},
      {"uint32", "::uint32_t"},
      {"uint64", "::uint64_t"},

      {"hrule_thick", kThickSeparator},
      {"hrule_thin", kThinSeparator},

      {"nullable", "PROTOBUF_NULLABLE"},
      {"nonnull", "PROTOBUF_NONNULL"},

      // Warning: there is some clever naming/splitting here to avoid extract
      // script rewrites.  The names of these variables must not be things that
      // the extract script will rewrite.  That's why we use "CHK" (for example)
      // instead of "ABSL_CHECK".
      //
      // These values are things the extract script would rewrite if we did not
      // split them.  It might not strictly matter since we don't generate
      // google3 code in open-source.  But it's good to prevent surprising
      // things from happening.
      {"GOOGLE_PROTOBUF", is_oss ? "GOOGLE_PROTOBUF"
                                 : "GOOGLE3_PROTOBU"
                                   "F"},
      {"CHK",
       "ABSL_CHEC"
       "K"},
      {"DCHK",
       "ABSL_DCHEC"
       "K"},
  };
}